

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::RenderCase::executeForConfig(RenderCase *this,EGLDisplay display,EGLConfig config)

{
  EglTestContext *pEVar1;
  NativeDisplayFactory *factory;
  NativeDisplay *nativeDisplay;
  int iVar2;
  deUint32 err;
  Library *egl;
  NativeWindowFactory *pNVar3;
  undefined4 extraout_var;
  EGLSurface pvVar4;
  NativePixmapFactory *pNVar5;
  NativePixmap *pixmap;
  undefined4 extraout_var_00;
  TestLog *log;
  allocator<char> local_186;
  allocator<char> local_185;
  EGLint configId;
  TestLog *local_180;
  UniqueSurface surface;
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  WindowParams params;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ScopedLogSection local_68;
  ScopedLogSection local_60;
  ScopedLogSection local_58;
  string failReason;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  log = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  configId = eglu::getConfigID(egl,display,config);
  pEVar1 = (this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx;
  factory = pEVar1->m_nativeDisplayFactory;
  nativeDisplay =
       (pEVar1->m_nativeDisplay).
       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failReason,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&surface);
  local_180 = log;
  if ((this->m_surfaceTypeMask & 4) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Config",&local_185);
    de::toString<int>((string *)&params,&configId);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                   &local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                   "-Window");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Config ID ",&local_186);
    de::toString<int>(&local_e8,&configId);
    std::operator+(&local_a8,&local_c8,&local_e8);
    std::operator+(&local_88,&local_a8,", window surface");
    tcu::ScopedLogSection::ScopedLogSection(&local_58,log,(string *)&surface,&local_88);
    tcu::ScopedLogSection::~ScopedLogSection(&local_58);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&surface);
    std::__cxx11::string::~string((string *)&window);
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::string::~string((string *)&local_130);
    pNVar3 = eglu::selectNativeWindowFactory
                       (factory,((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx)->m_cmdLine);
    params.visibility =
         eglu::parseWindowVisibility
                   (((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_cmdLine);
    params.width = 0x80;
    params.height = 0x80;
    iVar2 = (*(pNVar3->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar3,nativeDisplay,display,config);
    log = local_180;
    window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr
         = (NativeWindow *)CONCAT44(extraout_var,iVar2);
    pvVar4 = eglu::createWindowSurface
                       (nativeDisplay,
                        window.
                        super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                        .m_data.ptr,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface(&surface,egl,display,pvVar4);
    local_130._M_string_length = 4;
    local_130._M_dataplus._M_p = (pointer)config;
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,display,surface.m_surface);
    eglu::UniqueSurface::~UniqueSurface(&surface);
    de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
    ~UniqueBase(&window.
                 super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>);
  }
  if ((this->m_surfaceTypeMask & 2) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Config",&local_185);
    de::toString<int>((string *)&params,&configId);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                   &local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                   "-Pixmap");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Config ID ",&local_186);
    de::toString<int>(&local_e8,&configId);
    std::operator+(&local_a8,&local_c8,&local_e8);
    std::operator+(&local_88,&local_a8,", pixmap surface");
    tcu::ScopedLogSection::ScopedLogSection(&local_60,log,(string *)&surface,&local_88);
    tcu::ScopedLogSection::~ScopedLogSection(&local_60);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&surface);
    std::__cxx11::string::~string((string *)&window);
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::string::~string((string *)&local_130);
    pNVar5 = eglu::selectNativePixmapFactory
                       (factory,((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx)->m_cmdLine);
    pixmap = (NativePixmap *)
             (**(code **)(*(long *)pNVar5 + 0x20))(pNVar5,nativeDisplay,display,config,0,0x80,0x80);
    pvVar4 = eglu::createPixmapSurface(nativeDisplay,pixmap,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface(&surface,egl,display,pvVar4);
    window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
    _8_8_ = 2;
    window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr
         = (NativeWindow *)config;
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,display,surface.m_surface);
    eglu::UniqueSurface::~UniqueSurface(&surface);
    (**(code **)(*(long *)pixmap + 8))(pixmap);
    log = local_180;
  }
  if ((this->m_surfaceTypeMask & 1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Config",&local_185);
    de::toString<int>((string *)&params,&configId);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                   &local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&surface,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                   "-Pbuffer");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Config ID ",&local_186);
    de::toString<int>(&local_e8,&configId);
    std::operator+(&local_a8,&local_c8,&local_e8);
    std::operator+(&local_88,&local_a8,", pbuffer surface");
    tcu::ScopedLogSection::ScopedLogSection(&local_68,log,(string *)&surface,&local_88);
    tcu::ScopedLogSection::~ScopedLogSection(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&surface);
    std::__cxx11::string::~string((string *)&window);
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::string::~string((string *)&local_130);
    window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr
         = (NativeWindow *)0x8000003057;
    window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
    _8_8_ = 0x8000003056;
    iVar2 = (*egl->_vptr_Library[10])(egl,display,config,&window);
    eglu::UniqueSurface::UniqueSurface
              (&surface,egl,display,(EGLSurface)CONCAT44(extraout_var_00,iVar2));
    err = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(err,"eglCreatePbufferSurface()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                     ,0xbe);
    local_130._M_string_length = 1;
    local_130._M_dataplus._M_p = (pointer)config;
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,display,surface.m_surface);
    eglu::UniqueSurface::~UniqueSurface(&surface);
  }
  std::__cxx11::string::~string((string *)&failReason);
  return;
}

Assistant:

void RenderCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&						log				= m_testCtx.getLog();
	const int							width			= 128;
	const int							height			= 128;
	const EGLint						configId		= eglu::getConfigID(egl, display, config);

	const eglu::NativeDisplayFactory&	displayFactory	= m_eglTestCtx.getNativeDisplayFactory();
	eglu::NativeDisplay&				nativeDisplay	= m_eglTestCtx.getNativeDisplay();

	bool								isOk			= true;
	string								failReason		= "";

	if (m_surfaceTypeMask & EGL_WINDOW_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Window",
							  string("Config ID ") + de::toString(configId) + ", window surface");

		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(displayFactory, m_testCtx.getCommandLine());

		try
		{
			const eglu::WindowParams			params		(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()));
			de::UniquePtr<eglu::NativeWindow>	window		(windowFactory.createWindow(&nativeDisplay, display, config, DE_NULL, params));
			EGLSurface							eglSurface	= createWindowSurface(nativeDisplay, *window, display, config, DE_NULL);
			eglu::UniqueSurface					surface		(egl, display, eglSurface);

			executeForSurface(display, *surface, Config(config, EGL_WINDOW_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (m_surfaceTypeMask & EGL_PIXMAP_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Pixmap",
							  string("Config ID ") + de::toString(configId) + ", pixmap surface");

		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(displayFactory, m_testCtx.getCommandLine());

		try
		{
			std::auto_ptr<eglu::NativePixmap>	pixmap		(pixmapFactory.createPixmap(&nativeDisplay, display, config, DE_NULL, width, height));
			EGLSurface							eglSurface	= createPixmapSurface(nativeDisplay, *pixmap, display, config, DE_NULL);
			eglu::UniqueSurface					surface		(egl, display, eglSurface);

			executeForSurface(display, *surface, Config(config, EGL_PIXMAP_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (m_surfaceTypeMask & EGL_PBUFFER_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Pbuffer",
							  string("Config ID ") + de::toString(configId) + ", pbuffer surface");
		try
		{
			const EGLint surfaceAttribs[] =
			{
				EGL_WIDTH,	width,
				EGL_HEIGHT,	height,
				EGL_NONE
			};

			eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, surfaceAttribs));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

			executeForSurface(display, *surface, Config(config, EGL_PBUFFER_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason.c_str());
}